

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Workers.cpp
# Opt level: O2

void __thiscall
xmrig::Workers<xmrig::CpuLaunchData>::start
          (Workers<xmrig::CpuLaunchData> *this,
          vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_> *data)

{
  pointer pCVar1;
  IBackend *pIVar2;
  pointer ppTVar3;
  int64_t iVar4;
  Miner *pMVar5;
  bool bVar6;
  bool bVar7;
  undefined2 uVar8;
  int iVar9;
  undefined4 uVar10;
  Hashrate *this_00;
  CpuLaunchData *item;
  pointer pCVar11;
  pointer ppTVar12;
  Thread<xmrig::CpuLaunchData> *local_30;
  
  pCVar1 = (data->super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (pCVar11 = (data->
                 super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>).
                 _M_impl.super__Vector_impl_data._M_start; pCVar11 != pCVar1; pCVar11 = pCVar11 + 1)
  {
    local_30 = (Thread<xmrig::CpuLaunchData> *)operator_new(0x48);
    pIVar2 = this->d_ptr->backend;
    local_30->m_id =
         (long)(this->m_workers).
               super__Vector_base<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->m_workers).
               super__Vector_base<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3;
    bVar6 = pCVar11->hugePages;
    bVar7 = pCVar11->hwAES;
    uVar8 = *(undefined2 *)&pCVar11->field_0x6;
    iVar9 = pCVar11->priority;
    uVar10 = *(undefined4 *)&pCVar11->field_0xc;
    iVar4 = pCVar11->affinity;
    pMVar5 = pCVar11->miner;
    (local_30->m_config).assembly = (Assembly)(pCVar11->assembly).m_id;
    (local_30->m_config).hugePages = bVar6;
    (local_30->m_config).hwAES = bVar7;
    *(undefined2 *)&(local_30->m_config).field_0x6 = uVar8;
    (local_30->m_config).priority = iVar9;
    *(undefined4 *)&(local_30->m_config).field_0xc = uVar10;
    (local_30->m_config).affinity = iVar4;
    (local_30->m_config).miner = pMVar5;
    uVar10 = *(undefined4 *)&pCVar11->field_0x24;
    (local_30->m_config).intensity = pCVar11->intensity;
    *(undefined4 *)&(local_30->m_config).field_0x24 = uVar10;
    local_30->m_backend = pIVar2;
    local_30->m_worker = (IWorker *)0x0;
    (local_30->m_thread)._M_id._M_thread = 0;
    std::
    vector<xmrig::Thread<xmrig::CpuLaunchData>*,std::allocator<xmrig::Thread<xmrig::CpuLaunchData>*>>
    ::emplace_back<xmrig::Thread<xmrig::CpuLaunchData>*>
              ((vector<xmrig::Thread<xmrig::CpuLaunchData>*,std::allocator<xmrig::Thread<xmrig::CpuLaunchData>*>>
                *)this,&local_30);
  }
  this_00 = (Hashrate *)operator_new(0x20);
  Hashrate::Hashrate(this_00,(long)(this->m_workers).
                                   super__Vector_base<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->m_workers).
                                   super__Vector_base<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  this->d_ptr->hashrate = this_00;
  LOCK();
  Nonce::m_sequence = Nonce::m_sequence + 1;
  UNLOCK();
  ppTVar3 = (this->m_workers).
            super__Vector_base<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppTVar12 = (this->m_workers).
                  super__Vector_base<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppTVar12 != ppTVar3;
      ppTVar12 = ppTVar12 + 1) {
    Thread<xmrig::CpuLaunchData>::start(*ppTVar12,onReady);
  }
  return;
}

Assistant:

void xmrig::Workers<T>::start(const std::vector<T> &data)
{
    for (const T &item : data) {
        m_workers.push_back(new Thread<T>(d_ptr->backend, m_workers.size(), item));
    }

    d_ptr->hashrate = new Hashrate(m_workers.size());
    Nonce::touch(T::backend());

    for (Thread<T> *worker : m_workers) {
        worker->start(Workers<T>::onReady);
    }
}